

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O2

void RigidBodyDynamics::SolveContactSystemRangeSpaceSparse
               (Model *model,MatrixNd *H,MatrixNd *G,VectorNd *c,VectorNd *gamma,VectorNd *qddot,
               VectorNd *lambda,MatrixNd *K,VectorNd *a,LinearSolver linear_solver)

{
  VectorNd *dst;
  DenseStorage<double,__1,__1,_1,_0> *pDVar1;
  uint uVar2;
  ulong uVar3;
  MatrixNd Y;
  DenseStorage<double,__1,__1,_1,_0> local_c0;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> local_b0;
  ulong local_88;
  long local_80;
  void *local_78;
  long local_70;
  long local_68;
  MatrixNd *local_60;
  VectorNd *local_58;
  VectorNd *local_50;
  DenseStorage<double,__1,__1,_1,_0> *local_48;
  Solve<Eigen::LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_40;
  
  local_58 = gamma;
  local_50 = qddot;
  local_48 = (DenseStorage<double,__1,__1,_1,_0> *)c;
  Math::SparseFactorizeLTL(model,H);
  local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)G;
  local_60 = G;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_78,
             (Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_b0);
  for (uVar2 = 0; pDVar1 = local_48, uVar3 = (ulong)uVar2, (long)uVar3 < local_68; uVar2 = uVar2 + 1
      ) {
    local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)(local_70 * uVar3 * 8 + (long)local_78);
    local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_70;
    local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = 1;
    local_b0.m_isInitialized = false;
    local_b0._33_3_ = 0;
    local_b0.m_info = Success;
    local_80 = local_70;
    local_b0.m_l1_norm = (RealScalar)&local_78;
    local_88 = uVar3;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_c0,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
               &local_b0);
    Math::SparseSolveLTx(model,H,(VectorNd *)&local_c0);
    local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)(local_70 * uVar3 * 8 + (long)local_78);
    local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_70;
    local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = 1;
    local_b0.m_isInitialized = false;
    local_b0._33_3_ = 0;
    local_b0.m_info = Success;
    local_80 = local_70;
    local_b0.m_l1_norm = (RealScalar)&local_78;
    local_88 = uVar3;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_b0,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_c0);
    free(local_c0.m_data);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_c0,local_48);
  Math::SparseSolveLTx(model,H,(VectorNd *)&local_c0);
  dst = local_50;
  local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)&local_78;
  local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = (Index)&local_78;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            (K,(Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                *)&local_b0);
  local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)local_58;
  local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = (Index)&local_78;
  local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = (Index)&local_c0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
            (a,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_b0);
  Eigen::LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)&local_b0,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)K);
  local_40.m_rhs = a;
  local_40.m_dec = &local_b0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (lambda,&local_40);
  free(local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)pDVar1;
  local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = (Index)local_60;
  local_b0.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = (Index)lambda;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
            (dst,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_b0);
  Math::SparseSolveLTx(model,H,dst);
  Math::SparseSolveLx(model,H,dst);
  free(local_c0.m_data);
  free(local_78);
  return;
}

Assistant:

RBDL_DLLAPI
void SolveContactSystemRangeSpaceSparse (
		Model &model, 
		Math::MatrixNd &H, 
		const Math::MatrixNd &G, 
		const Math::VectorNd &c, 
		const Math::VectorNd &gamma, 
		Math::VectorNd &qddot, 
		Math::VectorNd &lambda, 
		Math::MatrixNd &K, 
		Math::VectorNd &a,
		Math::LinearSolver linear_solver
	) {
	SparseFactorizeLTL (model, H);

	MatrixNd Y (G.transpose());

	for (unsigned int i = 0; i < Y.cols(); i++) {
		VectorNd Y_col = Y.block(0,i,Y.rows(),1);
		SparseSolveLTx (model, H, Y_col);
		Y.block(0,i,Y.rows(),1) = Y_col;
	}

	VectorNd z (c);
	SparseSolveLTx (model, H, z);

	K = Y.transpose() * Y;

	a = gamma - Y.transpose() * z;

	lambda = K.llt().solve(a);

	qddot = c + G.transpose() * lambda;
	SparseSolveLTx (model, H, qddot);
	SparseSolveLx (model, H, qddot);
}